

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O2

size_t __thiscall
helix::parity::pmd_handler::process_packet(pmd_handler *this,packet_view *packet,bool sync)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  unknown_message_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cVar1 = *packet->_buf;
  switch(cVar1) {
  case 'A':
    sVar3 = process_msg<pmd_order_added>(this,packet,sync);
    return sVar3;
  case 'B':
    sVar3 = 9;
    break;
  case 'C':
switchD_0011cadb_caseD_43:
    this_00 = (unknown_message_type *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
    std::operator+(&local_38,"unknown type: ",&local_58);
    unknown_message_type::unknown_message_type(this_00,&local_38);
    __cxa_throw(this_00,&unknown_message_type::typeinfo,std::runtime_error::~runtime_error);
  case 'D':
    sVar3 = process_msg<pmd_order_deleted>(this,packet,sync);
    return sVar3;
  case 'E':
    sVar3 = process_msg<pmd_order_executed>(this,packet,sync);
    return sVar3;
  default:
    if (cVar1 == 'X') {
      sVar3 = process_msg<pmd_order_canceled>(this,packet,sync);
      return sVar3;
    }
    sVar3 = 5;
    if (cVar1 != 'V') {
      if (cVar1 != 'S') goto switchD_0011cadb_caseD_43;
      uVar2 = *(uint *)(packet->_buf + 1);
      this->_seconds =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
  }
  return sVar3;
}

Assistant:

void pmd_handler::subscribe(std::string sym, size_t max_orders)
{
    helix::order_book ob{sym, 0, max_orders};
    ob.set_state(trading_state::trading);
    auto padding = PMD_INSTRUMENT_LEN - sym.size();
    if (padding > 0) {
        sym.insert(sym.size(), padding, ' ');
    }
    _symbols.insert(sym);
    _order_book_id_map.emplace(sym, std::move(ob));
}